

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::QLabelPrivate(QLabelPrivate *this)

{
  long lVar1;
  Int IVar2;
  QFramePrivate *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  TextInteractionFlag in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFramePrivate::QFramePrivate(in_RDI);
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR__QLabelPrivate_00d147d8;
  QSize::QSize((QSize *)in_RDI);
  QSize::QSize((QSize *)in_RDI);
  QString::QString((QString *)0x5ad2d7);
  std::optional<QIcon>::optional((optional<QIcon> *)0x5ad2e8);
  QSize::QSize((QSize *)in_RDI);
  std::optional<QPicture>::optional((optional<QPicture> *)0x5ad30a);
  QPointer<QMovie>::QPointer((QPointer<QMovie> *)0x5ad31b);
  std::array<QMetaObject::Connection,_2UL>::array
            ((array<QMetaObject::Connection,_2UL> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  in_RDI[1].super_QWidgetPrivate.focus_next = (QWidget *)0x0;
  QTextCursor::QTextCursor((QTextCursor *)&in_RDI[1].super_QWidgetPrivate.focus_prev);
  QCursor::QCursor((QCursor *)&in_RDI[1].super_QWidgetPrivate.focus_child);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x5ad36a);
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.redirectDev = 0;
  *(undefined4 *)((long)&in_RDI[1].super_QWidgetPrivate.redirectDev + 4) = 2;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.widgetItem = 0;
  QFlags<Qt::TextInteractionFlag>::QFlags
            ((QFlags<Qt::TextInteractionFlag> *)in_RDI,in_stack_ffffffffffffffdc);
  QSizePolicy::QSizePolicy((QSizePolicy *)&in_RDI[1].super_QWidgetPrivate.extraPaintEngine);
  *(undefined4 *)((long)&in_RDI[1].super_QWidgetPrivate.extraPaintEngine + 4) = 0;
  Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff4);
  *(Int *)&in_RDI[1].super_QWidgetPrivate.polished = IVar2 | 0x400;
  *(undefined4 *)((long)&in_RDI[1].super_QWidgetPrivate.polished + 4) = 0xffffffff;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xfe;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xfd;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xfb;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xf7;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xef;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xdf;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0xbf;
  *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect =
       *(byte *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect & 0x7f;
  *(byte *)((long)&in_RDI[1].super_QWidgetPrivate.graphicsEffect + 1) =
       *(byte *)((long)&in_RDI[1].super_QWidgetPrivate.graphicsEffect + 1) & 0xfe;
  std::function<QVariant_(const_QUrl_&)>::function
            ((function<QVariant_(const_QUrl_&)> *)in_RDI,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLabelPrivate::QLabelPrivate()
    : QFramePrivate(),
      valid_hints(false),
      scaledcontents(false),
      textLayoutDirty(false),
      textDirty(false),
      isTextLabel(false),
      hasShortcut(false),
#ifndef QT_NO_CURSOR
      validCursor(false),
      onAnchor(false),
#endif
      openExternalLinks(false)
{
}